

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mine.cpp
# Opt level: O1

KBOOL __thiscall KDIS::DATA_TYPE::Mine::operator==(Mine *this,Mine *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = Vector::operator!=(&this->m_Loc,&Value->m_Loc);
  if ((((!KVar1) && (this->m_ui16ID == Value->m_ui16ID)) &&
      ((float)this->m_f32GrndOffset == (float)Value->m_f32GrndOffset)) &&
     (((!NAN((float)this->m_f32GrndOffset) && !NAN((float)Value->m_f32GrndOffset) &&
       ((float)this->m_f32WtrOffset == (float)Value->m_f32WtrOffset)) &&
      ((!NAN((float)this->m_f32WtrOffset) && !NAN((float)Value->m_f32WtrOffset) &&
       (((float)this->m_f32SnwOffset == (float)Value->m_f32SnwOffset &&
        (!NAN((float)this->m_f32SnwOffset) && !NAN((float)Value->m_f32SnwOffset))))))))) {
    KVar1 = EulerAngles::operator!=(&this->m_Ori,&Value->m_Ori);
    if ((!KVar1) &&
       (((((float)this->m_f32ThrmCont == (float)Value->m_f32ThrmCont &&
          (!NAN((float)this->m_f32ThrmCont) && !NAN((float)Value->m_f32ThrmCont))) &&
         ((float)this->m_f32Rflt == (float)Value->m_f32Rflt)) &&
        (!NAN((float)this->m_f32Rflt) && !NAN((float)Value->m_f32Rflt))))) {
      KVar1 = ClockTime::operator!=(&this->m_MET,&Value->m_MET);
      if (!KVar1) {
        KVar1 = MineFusing::operator!=(&this->m_MF,&Value->m_MF);
        if (!KVar1) {
          bVar2 = std::operator!=(&this->m_vui8SDC,&Value->m_vui8SDC);
          if (!bVar2) {
            KVar1 = MinePaintScheme::operator!=(&this->m_MPS,&Value->m_MPS);
            if (((!KVar1) && (this->m_ui8NumTrpDetWrs == Value->m_ui8NumTrpDetWrs)) &&
               ((this->m_mvVertices)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
                (Value->m_mvVertices)._M_t._M_impl.super__Rb_tree_header._M_node_count)) {
              bVar2 = std::__equal<false>::
                      equal<std::_Rb_tree_const_iterator<std::pair<unsigned_short_const,std::vector<KDIS::DATA_TYPE::Vector,std::allocator<KDIS::DATA_TYPE::Vector>>>>,std::_Rb_tree_const_iterator<std::pair<unsigned_short_const,std::vector<KDIS::DATA_TYPE::Vector,std::allocator<KDIS::DATA_TYPE::Vector>>>>>
                                ((this->m_mvVertices)._M_t._M_impl.super__Rb_tree_header._M_header.
                                 _M_left,(_Rb_tree_const_iterator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>
                                          )&(this->m_mvVertices)._M_t._M_impl.super__Rb_tree_header,
                                 (Value->m_mvVertices)._M_t._M_impl.super__Rb_tree_header._M_header.
                                 _M_left);
              return bVar2;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

KBOOL Mine::operator == ( const Mine & Value ) const
{
    if( m_Loc               != Value.m_Loc )            return false;
    if( m_ui16ID            != Value.m_ui16ID )         return false;
    if( m_f32GrndOffset     != Value.m_f32GrndOffset )  return false;
    if( m_f32WtrOffset      != Value.m_f32WtrOffset )   return false;
    if( m_f32SnwOffset      != Value.m_f32SnwOffset )   return false;
    if( m_Ori               != Value.m_Ori )            return false;
    if( m_f32ThrmCont       != Value.m_f32ThrmCont )    return false;
    if( m_f32Rflt           != Value.m_f32Rflt )        return false;
    if( m_MET               != Value.m_MET )            return false;
    if( m_MF                != Value.m_MF )             return false;
    if( m_vui8SDC           != Value.m_vui8SDC )        return false;
    if( m_MPS               != Value.m_MPS )            return false;
    if( m_ui8NumTrpDetWrs   != Value.m_ui8NumTrpDetWrs )return false;
    if( m_mvVertices        != Value.m_mvVertices )     return false;
    return true;
}